

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portal.cpp
# Opt level: O2

bool ChangePortalLine(line_t_conflict *line,int destid)

{
  FLinePortal *port;
  uint uVar1;
  bool bVar2;
  byte bVar3;
  line_t_conflict *plVar4;
  FLinePortal *pFVar5;
  FLinePortal *port_00;
  
  uVar1 = line->portalindex;
  if (linePortals.Count <= uVar1) {
    return false;
  }
  if (linePortals.Array[uVar1].mType == '\x03') {
    bVar2 = false;
  }
  else {
    port_00 = linePortals.Array + uVar1;
    if (destid == 0) {
      port_00->mDestination = (line_t *)0x0;
    }
    plVar4 = FindDestination(line,destid);
    port_00->mDestination = (line_t *)plVar4;
    if (plVar4 == (line_t_conflict *)0x0) {
      port_00->mFlags = '\0';
    }
    else if (port_00->mType == '\x02') {
      uVar1 = plVar4->portalindex;
      port = linePortals.Array + uVar1;
      bVar3 = port_00->mDefFlags;
      pFVar5 = port_00;
      if ((linePortals.Array[uVar1].mType == '\x02') &&
         ((line_t_conflict *)linePortals.Array[uVar1].mDestination == line)) {
        port_00->mFlags = bVar3 | 8;
        bVar3 = port->mDefFlags | 8;
        pFVar5 = port;
      }
      pFVar5->mFlags = bVar3;
      SetRotation(port);
    }
    SetRotation(port_00);
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

static bool ChangePortalLine(line_t *line, int destid)
{
	if (line->portalindex >= linePortals.Size()) return false;
	FLinePortal *port = &linePortals[line->portalindex];
	if (port->mType == PORTT_LINKED) return false;	// linked portals cannot be changed.
	if (destid == 0) port->mDestination = NULL;
	port->mDestination = FindDestination(line, destid);
	if (port->mDestination == NULL)
	{
		port->mFlags = 0;
	}
	else if (port->mType == PORTT_INTERACTIVE)
	{
		FLinePortal *portd = &linePortals[port->mDestination->portalindex];
		if (portd != NULL && portd->mType == PORTT_INTERACTIVE && portd->mDestination == line)
		{
			// this is a 2-way interactive portal
			port->mFlags = port->mDefFlags | PORTF_INTERACTIVE;
			portd->mFlags = portd->mDefFlags | PORTF_INTERACTIVE;
		}
		else
		{
			port->mFlags = port->mDefFlags;
		}
		SetRotation(portd);
	}
	SetRotation(port);
	return true;
}